

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerSafe::SetCommissionerDataset
          (Error *__return_storage_ptr__,CommissionerSafe *this,CommissionerDataset *aDataset)

{
  promise<ot::commissioner::Error> pro;
  __basic_future<ot::commissioner::Error> _Stack_68;
  promise<ot::commissioner::Error> local_58;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  std::promise<ot::commissioner::Error>::promise(&local_58);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:253:32)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:253:32)>
             ::_M_manager;
  local_40._M_unused._M_object = &local_58;
  (*(this->super_Commissioner)._vptr_Commissioner[0x13])(this,&local_40,aDataset);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__basic_future<ot::commissioner::Error>::__basic_future(&_Stack_68,&local_58._M_future);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&_Stack_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&_Stack_68._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<ot::commissioner::Error>::~promise(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::SetCommissionerDataset(const CommissionerDataset &aDataset)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    SetCommissionerDataset(wait, aDataset);
    return pro.get_future().get();
}